

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall Catch::ReporterConfig::ReporterConfig(ReporterConfig *this,IConfigPtr *_fullConfig)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(((_fullConfig->super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[3])();
  this->m_stream = (ostream *)CONCAT44(extraout_var,iVar1);
  clara::std::__shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_fullConfig).
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>,
             &_fullConfig->super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

ReporterConfig::ReporterConfig( IConfigPtr const& _fullConfig )
    :   m_stream( &_fullConfig->stream() ), m_fullConfig( _fullConfig ) {}